

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *this_01;
  XMLStringPool *pXVar4;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar5;
  uint uVar6;
  int iVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  DOMElement *pDVar10;
  DOMNode *node;
  XSAnnotation *pXVar11;
  XercesAttGroupInfo *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SchemaAttDef *pSVar13;
  undefined4 extraout_var_02;
  char16_t *pcVar14;
  ulong uVar15;
  SchemaAttDef *pSVar16;
  short *psVar17;
  XercesAttGroupInfo *pXVar18;
  XMLSize_t XVar19;
  XMLCh XVar20;
  XMLSize_t XVar21;
  RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *pRVar22;
  bool bVar23;
  bool bVar24;
  NamespaceScopeManager nsMgr;
  XSAnnotation *local_58;
  NamespaceScopeManager local_40;
  short *psVar12;
  
  pSVar3 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar3;
  pXVar8 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  pXVar9 = getElementAttValue(this,elem,L"ref",QName);
  if (pXVar8 == (XMLCh *)0x0) {
    bVar23 = false;
  }
  else {
    bVar23 = *pXVar8 != L'\0';
  }
  if (pXVar9 == (XMLCh *)0x0) {
    bVar24 = true;
  }
  else {
    bVar24 = *pXVar9 == L'\0';
  }
  if (topLevel && !bVar23) {
    this_02 = (XercesAttGroupInfo *)0x0;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x55,L"attributeGroup",
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_00333ea1;
  }
  if (bVar23 || bVar24 != true) {
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,elem,topLevel ^ 9,this,topLevel,this->fNonXSAttList);
    if (topLevel) {
      XVar19 = 0;
      if (pXVar8 != (XMLCh *)0x0) {
        do {
          psVar12 = (short *)((long)pXVar8 + XVar19);
          XVar19 = XVar19 + 2;
        } while (*psVar12 != 0);
        XVar19 = ((long)XVar19 >> 1) - 1;
      }
      bVar23 = XMLChar1_0::isValidNCName(pXVar8,XVar19);
      if (!bVar23) {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,
                          L"attributeGroup",pXVar8,(XMLCh *)0x0,(XMLCh *)0x0);
        goto LAB_00333e9f;
      }
      pDVar10 = XUtil::getFirstChildElement(&elem->super_DOMNode);
      node = &checkContent(this,elem,pDVar10,true,true)->super_DOMNode;
      if (((this->fScanner->fGenerateSyntheticAnnotations == true) &&
          (this->fAnnotation == (XSAnnotation *)0x0)) && (this->fNonXSAttList->fCurCount != 0)) {
        pXVar11 = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
        this->fAnnotation = pXVar11;
      }
      pXVar11 = this->fAnnotation;
      pXVar18 = this->fCurrentAttGroupInfo;
      this_02 = (XercesAttGroupInfo *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager);
      uVar6 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fStringPool,pXVar8);
      XercesAttGroupInfo::XercesAttGroupInfo
                (this_02,uVar6,this->fTargetNSURI,this->fGrammarPoolMemoryManager);
      this_01 = this->fDeclStack;
      ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(this_01,1);
      XVar19 = this_01->fCurCount;
      this_01->fCurCount = XVar19 + 1;
      this_01->fElemList[XVar19] = elem;
      this->fCurrentAttGroupInfo = this_02;
      for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
        iVar7 = (*node->_vptr_DOMNode[0x18])(node);
        psVar12 = (short *)CONCAT44(extraout_var,iVar7);
        if (psVar12 == &SchemaSymbols::fgELT_ATTRIBUTE) {
LAB_00333e1c:
          traverseAttributeDecl(this,(DOMElement *)node,typeInfo,false);
        }
        else {
          psVar17 = &SchemaSymbols::fgELT_ATTRIBUTE;
          if (psVar12 == (short *)0x0) {
LAB_00333dd0:
            if (*psVar17 == 0) goto LAB_00333e1c;
          }
          else {
            psVar17 = &SchemaSymbols::fgELT_ATTRIBUTE;
            do {
              sVar1 = *psVar12;
              if (sVar1 == 0) goto LAB_00333dd0;
              psVar12 = psVar12 + 1;
              sVar2 = *psVar17;
              psVar17 = psVar17 + 1;
            } while (sVar1 == sVar2);
          }
          iVar7 = (*node->_vptr_DOMNode[0x18])(node);
          psVar12 = (short *)CONCAT44(extraout_var_00,iVar7);
          if (psVar12 != &SchemaSymbols::fgELT_ATTRIBUTEGROUP) {
            psVar17 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
            if (psVar12 != (short *)0x0) {
              psVar17 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
              while (sVar1 = *psVar12, sVar1 != 0) {
                psVar12 = psVar12 + 1;
                sVar2 = *psVar17;
                psVar17 = psVar17 + 1;
                if (sVar1 != sVar2) goto LAB_00333f07;
              }
            }
            if (*psVar17 != 0) {
LAB_00333f07:
              iVar7 = (*node->_vptr_DOMNode[0x18])(node);
              bVar23 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar7),L"anyAttribute");
              if (bVar23) {
                pSVar13 = traverseAnyAttribute(this,(DOMElement *)node);
                if (pSVar13 != (SchemaAttDef *)0x0) {
                  XercesAttGroupInfo::addAnyAttDef(this->fCurrentAttGroupInfo,pSVar13,false);
                }
                pDVar10 = XUtil::getNextSiblingElement(node);
                if (pDVar10 != (DOMElement *)0x0) {
                  reportSchemaError(this,(DOMElement *)node,
                                    L"http://apache.org/xml/messages/XMLErrors",0x65,pXVar8,
                                    (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                }
              }
              else {
                reportSchemaError(this,(DOMElement *)node,
                                  L"http://apache.org/xml/messages/XMLErrors",0x65,pXVar8,
                                  (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
              }
              break;
            }
          }
          traverseAttributeGroupDecl(this,(DOMElement *)node,typeInfo,false);
        }
      }
      ValueVectorOf<const_xercesc_4_0::DOMElement_*>::removeElementAt
                (this->fDeclStack,this->fDeclStack->fCurCount - 1);
      pXVar4 = this->fStringPool;
      pRVar5 = this->fAttGroupRegistry;
      uVar6 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4,pXVar8);
      iVar7 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar6);
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                (pRVar5,(void *)CONCAT44(extraout_var_02,iVar7),this_02);
      this->fCurrentAttGroupInfo = pXVar18;
      this_00 = &this->fBuffer;
      pXVar9 = this->fTargetNSURIString;
      (this->fBuffer).fIndex = 0;
      if ((pXVar9 != (XMLCh *)0x0) && (*pXVar9 != L'\0')) {
        XMLBuffer::append(this_00,pXVar9);
      }
      if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
      }
      XVar19 = (this->fBuffer).fIndex;
      (this->fBuffer).fIndex = XVar19 + 1;
      (this->fBuffer).fBuffer[XVar19] = L',';
      XMLBuffer::append(this_00,pXVar8);
      pXVar4 = this->fStringPool;
      (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
      iVar7 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])();
      if ((this->fRedefineComponents !=
           (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) &&
         (pcVar14 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                              (this->fRedefineComponents,&SchemaSymbols::fgELT_ATTRIBUTEGROUP,iVar7)
         , pcVar14 != (char16_t *)0x0)) {
        this_00->fIndex = 0;
        if ((pXVar8 != (XMLCh *)0x0) && (*pXVar8 != L'\0')) {
          XMLBuffer::append(this_00,pXVar8);
        }
        XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
        pRVar5 = this->fAttGroupRegistry;
        pXVar8 = (this->fBuffer).fBuffer;
        pXVar8[(this->fBuffer).fIndex] = L'\0';
        if ((pXVar8 == (XMLCh *)0x0) || (uVar15 = (ulong)(ushort)*pXVar8, uVar15 == 0)) {
          uVar15 = 0;
        }
        else {
          XVar20 = pXVar8[1];
          if (XVar20 != L'\0') {
            pXVar9 = pXVar8 + 2;
            do {
              uVar15 = (ulong)(ushort)XVar20 + (uVar15 >> 0x18) + uVar15 * 0x26;
              XVar20 = *pXVar9;
              pXVar9 = pXVar9 + 1;
            } while (XVar20 != L'\0');
          }
          uVar15 = uVar15 % pRVar5->fHashModulus;
        }
        pRVar22 = pRVar5->fBucketList[uVar15];
        if (pRVar22 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
          do {
            bVar23 = StringHasher::equals((StringHasher *)&pRVar5->field_0x30,pXVar8,pRVar22->fKey);
            if (bVar23) goto LAB_003341ae;
            pRVar22 = pRVar22->fNext;
          } while (pRVar22 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0);
        }
        pRVar22 = (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0;
LAB_003341ae:
        if (pRVar22 == (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
          pXVar18 = (XercesAttGroupInfo *)0x0;
        }
        else {
          pXVar18 = pRVar22->fData;
        }
        if (pXVar18 != (XercesAttGroupInfo *)0x0) {
          checkAttDerivationOK(this,elem,pXVar18,this_02);
        }
      }
      local_58 = pXVar11;
      if (pXVar11 != (XSAnnotation *)0x0) {
        local_58 = (XSAnnotation *)0x0;
        SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_02,pXVar11);
      }
      if (local_58 != (XSAnnotation *)0x0) {
        (*(local_58->super_XSerializable)._vptr_XSerializable[1])();
      }
    }
    else {
      if (bVar24) goto LAB_00333e9f;
      this_02 = processAttributeGroupRef(this,elem,pXVar9,typeInfo);
    }
    if (this_02 != (XercesAttGroupInfo *)0x0) {
      if (this_02->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
        XVar19 = 0;
      }
      else {
        XVar19 = (this_02->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
                 fCurCount;
      }
      if ((XVar19 != 0) && (this_02->fCompleteWildCard == (SchemaAttDef *)0x0)) {
        pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
        if (&this_02->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
            (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
          pSVar16 = (SchemaAttDef *)0x0;
        }
        else {
          pSVar16 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                              (&this_02->fAnyAttributes->
                                super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,0);
        }
        SchemaAttDef::SchemaAttDef(pSVar13,pSVar16);
        if (XVar19 != 1) {
          XVar21 = 2;
          if (2 < XVar19) {
            XVar21 = XVar19;
          }
          XVar19 = 1;
          do {
            if (&this_02->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
                (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
              pSVar16 = (SchemaAttDef *)0x0;
            }
            else {
              pSVar16 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                                  (&this_02->fAnyAttributes->
                                    super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,XVar19);
            }
            attWildCardIntersection(this,pSVar13,pSVar16);
            XVar19 = XVar19 + 1;
          } while (XVar21 != XVar19);
        }
        if (this_02->fCompleteWildCard != (SchemaAttDef *)0x0) {
          (*(this_02->fCompleteWildCard->super_XMLAttDef).super_XSerializable._vptr_XSerializable[1]
          )();
        }
        this_02->fCompleteWildCard = pSVar13;
      }
    }
  }
  else {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x13);
LAB_00333e9f:
    this_02 = (XercesAttGroupInfo *)0x0;
  }
LAB_00333ea1:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return this_02;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh* ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool         nameEmpty = (!name || !*name) ? true : false;
    bool         refEmpty = (!ref || !*ref) ? true : false;

    if (nameEmpty && topLevel) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP);
        return 0;
    }

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttGroup);
        return 0;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_AttributeGroupGlobal
                                      : GeneralAttributeCheck::E_AttributeGroupRef;
    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // ------------------------------------------------------------------
    // Handle "ref="
    // ------------------------------------------------------------------
    XercesAttGroupInfo* attGroupInfo;
    Janitor<XercesAttGroupInfo> janAttGroupInfo(0);
    if (!topLevel) {

        if (refEmpty) {
            return 0;
        }

        attGroupInfo = processAttributeGroupRef(elem, ref, typeInfo);
    }
    else
    {
        // name must be a valid NCName
        if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, name);
            return 0;
        }

        // Check for annotations
        DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
        if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
        {
            fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        }
        Janitor<XSAnnotation> janAnnot(fAnnotation);

        // Process contents of global attributeGroups
        XercesAttGroupInfo* saveAttGroupInfo = fCurrentAttGroupInfo;
        janAttGroupInfo.reset(new (fGrammarPoolMemoryManager) XercesAttGroupInfo(
            fStringPool->addOrFind(name), fTargetNSURI, fGrammarPoolMemoryManager));

        fDeclStack->addElement(elem);
        fCurrentAttGroupInfo = janAttGroupInfo.get();

        for (; content !=0; content = XUtil::getNextSiblingElement(content)) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTE)) {
                traverseAttributeDecl(content, typeInfo);
            }
            else if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
                traverseAttributeGroupDecl(content, typeInfo);
            }
            else {
                break;
            }
        }

        if (content != 0) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANYATTRIBUTE)) {

                SchemaAttDef* anyAtt = traverseAnyAttribute(content);

                if (anyAtt) {
                    fCurrentAttGroupInfo->addAnyAttDef(anyAtt);
                }

                if (XUtil::getNextSiblingElement(content) != 0) {
                    reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
                }
            }
            else {
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
            }
        }

        // Pop declaration
        fDeclStack->removeElementAt(fDeclStack->size() - 1);

        fAttGroupRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), janAttGroupInfo.get());
        // Restore old attGroupInfo
        attGroupInfo = janAttGroupInfo.release();
        fCurrentAttGroupInfo = saveAttGroupInfo;

        // Check Attribute Derivation Restriction OK
        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(name);

        unsigned int nameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());

        if (fRedefineComponents && fRedefineComponents->get(SchemaSymbols::fgELT_ATTRIBUTEGROUP, nameIndex)) {

            fBuffer.set(name);
            fBuffer.append(SchemaSymbols::fgRedefIdentifier);
            XercesAttGroupInfo* baseAttGroupInfo = fAttGroupRegistry->get(fBuffer.getRawBuffer());

            if (baseAttGroupInfo)
                checkAttDerivationOK(elem, baseAttGroupInfo, attGroupInfo);
        }

        // Store annotation
        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(attGroupInfo, janAnnot.release());
    }

    // calculate complete wildcard if necessary
    if (attGroupInfo)
    {
        XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();
        if (anyAttCount && !attGroupInfo->getCompleteWildCard())
        {
            SchemaAttDef* attGroupWildCard =  new (fGrammarPoolMemoryManager)
                SchemaAttDef(attGroupInfo->anyAttributeAt(0));

            for (XMLSize_t k= 1; k < anyAttCount; k++)
                attWildCardIntersection(attGroupWildCard, attGroupInfo->anyAttributeAt(k));

            attGroupInfo->setCompleteWildCard(attGroupWildCard);
        }
    }

    return attGroupInfo;
}